

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_mask.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<signed_char,signed_char,signed_char,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseOROperator,bool,true,false>
               (char *ldata,char *rdata,char *result_data,idx_t count,ValidityMask *mask,bool fun)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  idx_t i;
  idx_t iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar1 == (unsigned_long *)0x0) {
    for (iVar4 = 0; count != iVar4; iVar4 = iVar4 + 1) {
      result_data[iVar4] = rdata[iVar4] | *ldata;
    }
  }
  else {
    uVar6 = 0;
    for (uVar5 = 0; uVar5 != count + 0x3f >> 6; uVar5 = uVar5 + 1) {
      uVar2 = puVar1[uVar5];
      uVar7 = uVar6 + 0x40;
      if (count <= uVar6 + 0x40) {
        uVar7 = count;
      }
      uVar3 = uVar7;
      if (uVar2 != 0) {
        if (uVar2 == 0xffffffffffffffff) {
          for (; uVar3 = uVar6, uVar6 < uVar7; uVar6 = uVar6 + 1) {
            result_data[uVar6] = rdata[uVar6] | *ldata;
          }
        }
        else {
          for (uVar8 = 0; uVar3 = uVar6 + uVar8, uVar6 + uVar8 < uVar7; uVar8 = uVar8 + 1) {
            if ((uVar2 >> (uVar8 & 0x3f) & 1) != 0) {
              result_data[uVar8 + uVar6] = rdata[uVar8 + uVar6] | *ldata;
            }
          }
        }
      }
      uVar6 = uVar3;
    }
  }
  return;
}

Assistant:

inline bool AllValid() const {
		return !validity_mask;
	}